

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O0

unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_> cppurses::input::get(void)

{
  int input_00;
  __uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true> in_RDI;
  int input;
  
  input_00 = wgetch(_stdscr);
  if (input_00 == -1) {
    std::unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>>::
    unique_ptr<std::default_delete<cppurses::Event>,void>
              ((unique_ptr<cppurses::Event,std::default_delete<cppurses::Event>> *)
               in_RDI.super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
               _M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
               .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,(nullptr_t)0x0);
  }
  else if (input_00 == 0x199) {
    anon_unknown.dwarf_128aeb::make_mouse_event();
  }
  else if (input_00 == 0x19a) {
    anon_unknown.dwarf_128aeb::make_resize_event();
  }
  else {
    anon_unknown.dwarf_128aeb::make_keyboard_event
              ((anon_unknown_dwarf_128aeb *)
               in_RDI.super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>.
               _M_t.super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>
               .super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl,input_00);
  }
  return (__uniq_ptr_data<cppurses::Event,_std::default_delete<cppurses::Event>,_true,_true>)
         (tuple<cppurses::Event_*,_std::default_delete<cppurses::Event>_>)
         in_RDI.super___uniq_ptr_impl<cppurses::Event,_std::default_delete<cppurses::Event>_>._M_t.
         super__Tuple_impl<0UL,_cppurses::Event_*,_std::default_delete<cppurses::Event>_>.
         super__Head_base<0UL,_cppurses::Event_*,_false>._M_head_impl;
}

Assistant:

auto get() -> std::unique_ptr<Event>
{
    const auto input = ::getch();
    switch (input) {
        case ERR: return nullptr;  // Timeout and no event.
        case KEY_MOUSE: return make_mouse_event();
        case KEY_RESIZE: return make_resize_event();
        default: return make_keyboard_event(input);  // Key_event
    }
}